

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

int make_hot_sv(svm_params *params,size_t svi)

{
  float fVar1;
  float fVar2;
  ulong *puVar3;
  ulong uVar4;
  svm_example *this;
  svm_example *psVar5;
  ostream *poVar6;
  void *this_00;
  svm_example **ppsVar7;
  float *pfVar8;
  size_t sVar9;
  ulong in_RSI;
  long in_RDI;
  size_t i_2;
  float kv_1;
  size_t i_1;
  float kv;
  size_t rowsize;
  svm_example *e;
  size_t j;
  size_t i;
  float svi_delta;
  float svi_alpha;
  int alloc;
  svm_example *svi_e;
  size_t n;
  svm_model *model;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  svm_params *in_stack_ffffffffffffff88;
  size_t i_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float fVar10;
  size_t local_68;
  size_t local_48;
  size_t local_40;
  int local_2c;
  
  puVar3 = *(ulong **)(in_RDI + 0x38);
  uVar4 = *puVar3;
  if (*puVar3 <= in_RSI) {
    poVar6 = std::operator<<((ostream *)(*(long *)(in_RDI + 0x88) + 0xe0),"Internal error at ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/kernel_svm.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    this_00 = (void *)std::ostream::operator<<(poVar6,0x99);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  ppsVar7 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar3 + 1),in_RSI);
  this = *ppsVar7;
  local_2c = svm_example::compute_kernels
                       ((svm_example *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                        ,in_stack_ffffffffffffff88);
  pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 5),in_RSI);
  fVar10 = *pfVar8;
  pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 9),in_RSI);
  fVar1 = *pfVar8;
  for (local_40 = in_RSI; local_40 != 0; local_40 = local_40 - 1) {
    ppsVar7 = v_array<svm_example_*>::operator[]
                        ((v_array<svm_example_*> *)(puVar3 + 1),local_40 - 1);
    psVar5 = *ppsVar7;
    ppsVar7 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar3 + 1),local_40);
    *ppsVar7 = psVar5;
    pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 5),local_40 - 1);
    fVar2 = *pfVar8;
    pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 5),local_40);
    *pfVar8 = fVar2;
    pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 9),local_40 - 1);
    fVar2 = *pfVar8;
    pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 9),local_40);
    *pfVar8 = fVar2;
  }
  ppsVar7 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar3 + 1),0);
  *ppsVar7 = this;
  pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 5),0);
  *pfVar8 = fVar10;
  pfVar8 = v_array<float>::operator[]((v_array<float> *)(puVar3 + 9),0);
  *pfVar8 = fVar1;
  for (local_48 = 0; local_48 < uVar4; local_48 = local_48 + 1) {
    ppsVar7 = v_array<svm_example_*>::operator[]((v_array<svm_example_*> *)(puVar3 + 1),local_48);
    psVar5 = *ppsVar7;
    sVar9 = v_array<float>::size(&psVar5->krow);
    if (in_RSI < sVar9) {
      pfVar8 = v_array<float>::operator[](&psVar5->krow,in_RSI);
      in_stack_ffffffffffffff60 = *pfVar8;
      for (local_68 = in_RSI; local_68 != 0; local_68 = local_68 - 1) {
        pfVar8 = v_array<float>::operator[](&psVar5->krow,local_68 - 1);
        in_stack_ffffffffffffff64 = *pfVar8;
        pfVar8 = v_array<float>::operator[](&psVar5->krow,local_68);
        *pfVar8 = in_stack_ffffffffffffff64;
      }
      pfVar8 = v_array<float>::operator[](&psVar5->krow,0);
      *pfVar8 = in_stack_ffffffffffffff60;
    }
    else {
      pfVar8 = v_array<float>::operator[](&this->krow,local_48);
      fVar10 = *pfVar8;
      v_array<float>::push_back
                ((v_array<float> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (float *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_2c = local_2c + 1;
      sVar9 = v_array<float>::size(&psVar5->krow);
      in_stack_ffffffffffffff58 = fVar10;
      while (i_00 = sVar9 - 1, i_00 != 0) {
        pfVar8 = v_array<float>::operator[](&psVar5->krow,sVar9 - 2);
        in_stack_ffffffffffffff5c = *pfVar8;
        pfVar8 = v_array<float>::operator[](&psVar5->krow,i_00);
        *pfVar8 = in_stack_ffffffffffffff5c;
        sVar9 = i_00;
      }
      pfVar8 = v_array<float>::operator[](&psVar5->krow,0);
      *pfVar8 = in_stack_ffffffffffffff58;
    }
  }
  return local_2c;
}

Assistant:

static int make_hot_sv(svm_params& params, size_t svi)
{
  svm_model* model = params.model;
  size_t n = model->num_support;
  if (svi >= model->num_support)
    params.all->trace_message << "Internal error at " << __FILE__ << ":" << __LINE__ << endl;
  // rotate params fields
  svm_example* svi_e = model->support_vec[svi];
  int alloc = svi_e->compute_kernels(params);
  float svi_alpha = model->alpha[svi];
  float svi_delta = model->delta[svi];
  for (size_t i = svi; i > 0; --i)
  {
    model->support_vec[i] = model->support_vec[i - 1];
    model->alpha[i] = model->alpha[i - 1];
    model->delta[i] = model->delta[i - 1];
  }
  model->support_vec[0] = svi_e;
  model->alpha[0] = svi_alpha;
  model->delta[0] = svi_delta;
  // rotate cache
  for (size_t j = 0; j < n; j++)
  {
    svm_example* e = model->support_vec[j];
    size_t rowsize = e->krow.size();
    if (svi < rowsize)
    {
      float kv = e->krow[svi];
      for (size_t i = svi; i > 0; --i) e->krow[i] = e->krow[i - 1];
      e->krow[0] = kv;
    }
    else
    {
      float kv = svi_e->krow[j];
      e->krow.push_back(0);
      alloc += 1;
      for (size_t i = e->krow.size() - 1; i > 0; --i) e->krow[i] = e->krow[i - 1];
      e->krow[0] = kv;
    }
  }
  return alloc;
}